

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_still_picture(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  ushort uVar1;
  uint uVar2;
  long *plVar3;
  
  uVar2 = args->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    plVar3 = (long *)((ulong)uVar2 + (long)args->reg_save_area);
    args->gp_offset = uVar2 + 8;
  }
  else {
    plVar3 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar3 + 1;
  }
  if ((ulong *)*plVar3 != (ulong *)0x0) {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      uVar1 = *(ushort *)(*ctx->frame_worker->data1 + 0x5f7a1);
      *(ulong *)*plVar3 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
      return AOM_CODEC_OK;
    }
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_still_picture(aom_codec_alg_priv_t *ctx,
                                              va_list args) {
  aom_still_picture_info *const still_picture_info =
      va_arg(args, aom_still_picture_info *);
  if (still_picture_info) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      still_picture_info->is_still_picture = (int)pbi->seq_params.still_picture;
      still_picture_info->is_reduced_still_picture_hdr =
          (int)(pbi->seq_params.reduced_still_picture_hdr);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}